

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget_p.h
# Opt level: O2

void __thiscall QListWidgetPrivate::QListWidgetPrivate(QListWidgetPrivate *this)

{
  QListViewPrivate::QListViewPrivate(&this->super_QListViewPrivate);
  *(undefined ***)
   &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.super_QAbstractScrollAreaPrivate.
    super_QFramePrivate.super_QWidgetPrivate = &PTR__QListWidgetPrivate_007e8970;
  *(undefined4 *)&(this->super_QListViewPrivate).field_0x5bc = 0;
  this->sortingEnabled = false;
  (this->supportedDragActions).super__Optional_base<QFlags<Qt::DropAction>,_true,_true>._M_payload.
  super__Optional_payload_base<QFlags<Qt::DropAction>_>._M_engaged = false;
  std::array<QMetaObject::Connection,_8UL>::array(&this->connections);
  std::array<QMetaObject::Connection,_2UL>::array(&this->selectionModelConnections);
  return;
}

Assistant:

QListWidgetPrivate() : QListViewPrivate(), sortOrder(Qt::AscendingOrder), sortingEnabled(false) {}